

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::DisposableOwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>::
disposeImpl(DisposableOwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>
            *this,void *pointer)

{
  void *pointer_local;
  DisposableOwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_> *this_local;
  
  if (this != (DisposableOwnedBundle<kj::Own<kj::HttpServer::Connection>,_kj::Own<kj::HttpService>_>
               *)0x0) {
    ~DisposableOwnedBundle(this);
    operator_delete(this,0x28);
  }
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }